

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O3

void __thiscall helics::apps::App::loadConfigOptions(App *this,AppTextParser *aparser)

{
  undefined8 this_00;
  istringstream sstr;
  undefined1 local_190 [128];
  ios_base local_110 [264];
  
  if ((aparser->configStr)._M_string_length != 0) {
    generateParser((App *)local_190);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)(local_190 + 8),(string *)&aparser->configStr,_S_in);
    this_00 = local_190._0_8_;
    if (*(uint32_t *)(local_190._0_8_ + 0x2e4) == 0) {
      CLI::App::_validate((App *)local_190._0_8_);
      CLI::App::_configure((App *)this_00);
    }
    CLI::App::_parse_stream((App *)this_00,(istream *)(local_190 + 8));
    CLI::App::run_callback((App *)this_00,false,false);
    std::__cxx11::istringstream::~istringstream((istringstream *)(local_190 + 8));
    std::ios_base::~ios_base(local_110);
    if ((App *)local_190._0_8_ != (App *)0x0) {
      (*(*(_func_int ***)local_190._0_8_)[1])();
    }
  }
  return;
}

Assistant:

void App::loadConfigOptions(AppTextParser& aparser)
{
    const auto& configStr = aparser.configString();
    if (!configStr.empty()) {
        auto app = generateParser();
        std::istringstream sstr(configStr);
        app->parse_from_stream(sstr);
    }
}